

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O3

bool __thiscall IniProcessing::parseFile(IniProcessing *this,char *filename)

{
  bool bVar1;
  FILE *__stream;
  size_t __n;
  char *data;
  size_t sVar2;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    (this->m_params).errorCode = ERR_NOFILE;
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    if ((long)__n < 0) {
      (this->m_params).errorCode = ERR_KEY_SYNTAX;
      fclose(__stream);
    }
    else {
      fseek(__stream,0,0);
      data = (char *)malloc(__n + 2);
      if (data != (char *)0x0) {
        sVar2 = fread(data,1,__n,__stream);
        fclose(__stream);
        if (sVar2 == __n) {
          data[__n] = '\0';
          bVar1 = parseHelper(this,data,__n);
        }
        else {
          bVar1 = false;
        }
        free(data);
        return bVar1;
      }
      fclose(__stream);
      (this->m_params).errorCode = ERR_NO_MEMORY;
    }
  }
  return false;
}

Assistant:

bool IniProcessing::parseFile(const char *filename)
{
    bool valid = true;
    char *tmp = nullptr;

#ifdef USE_FILE_MAPPER
    //By mystical reasons, reading whole file form fread() is faster than mapper :-P
    PGE_FileMapper file(filename);

    if(!file.data)
    {
        m_params.errorCode = ERR_NOFILE;
        return -1;
    }

    tmp = reinterpret_cast<char *>(malloc(static_cast<size_t>(file.size + 1)));

    if(!tmp)
    {
        m_params.errorCode = ERR_NO_MEMORY;
        return false;
    }

    memcpy(tmp, file.data, static_cast<size_t>(file.size));
    *(tmp + file.size) = '\0';//null terminate last line
    valid = ini_parse_file(tmp, static_cast<size_t>(file.size));
#else
#   ifdef _WIN32
    //Convert UTF8 file path into UTF16 to support non-ASCII paths on Windows
    std::wstring dest = s_str_to_wstr(filename);
    FILE *cFile = _wfopen(dest.c_str(), L"rb");
#   else
    FILE *cFile = fopen(filename, "rb");
#   endif

    if(!cFile)
    {
        m_params.errorCode = ERR_NOFILE;
        return false;
    }

    fseek(cFile, 0, SEEK_END);
    ssize_t size = static_cast<ssize_t>(ftell(cFile));
    if(size < 0)
    {
        m_params.errorCode = ERR_KEY_SYNTAX;
        fclose(cFile);
        return false;
    }

    fseek(cFile, 0, SEEK_SET);
    tmp = reinterpret_cast<char *>(malloc(static_cast<size_t>(size + 2)));
    if(!tmp)
    {
        fclose(cFile);
        m_params.errorCode = ERR_NO_MEMORY;
        return false;
    }

    if(fread(tmp, 1, static_cast<size_t>(size), cFile) != static_cast<size_t>(size))
        valid = false;

    fclose(cFile);

    if(valid)
    {
        *(tmp + size) = '\0'; // null terminate last line
#ifdef _WIN32
        if(size > 2 && static_cast<uint8_t>(tmp[0]) == 0xFF && static_cast<uint8_t>(tmp[1]) == 0xFE) // is UTF16
        {
            *(tmp + size + 1) = '\0';
            // Convert entire stuff into UTF-8
            std::string tmp8 = s_wstr_to_str(std::wstring((wchar_t*)(tmp + 2), (size - 2) / 2));
            std::memcpy(tmp, tmp8.c_str(), tmp8.size());
            size = tmp8.size();
            *(tmp + size) = '\0';//null terminate last line
            m_params.is_utf16 = true;
        }
#endif

        try
        {
            valid = parseHelper(tmp, static_cast<size_t>(size));
        }
        catch(...)
        {
            valid = false;
            m_params.errorCode = ERR_SECTION_SYNTAX;
        }
    }
#endif

    free(tmp);
    return valid;
}